

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3PagerOpenWal(Pager *pPager,int *pbOpen)

{
  int iVar1;
  undefined4 *in_RSI;
  Pager *in_RDI;
  int rc;
  undefined4 in_stack_ffffffffffffffe0;
  int local_4;
  
  local_4 = 0;
  if ((in_RDI->tempFile == '\0') && (in_RDI->pWal == (Wal *)0x0)) {
    iVar1 = sqlite3PagerWalSupported(in_RDI);
    if (iVar1 == 0) {
      local_4 = 0xe;
    }
    else {
      sqlite3OsClose((sqlite3_file *)0x169db7);
      local_4 = pagerOpenWal((Pager *)CONCAT44(local_4,in_stack_ffffffffffffffe0));
      if (local_4 == 0) {
        in_RDI->journalMode = '\x05';
        in_RDI->eState = '\0';
      }
    }
  }
  else {
    *in_RSI = 1;
  }
  return local_4;
}

Assistant:

SQLITE_PRIVATE int sqlite3PagerOpenWal(
  Pager *pPager,                  /* Pager object */
  int *pbOpen                     /* OUT: Set to true if call is a no-op */
){
  int rc = SQLITE_OK;             /* Return code */

  assert( assert_pager_state(pPager) );
  assert( pPager->eState==PAGER_OPEN   || pbOpen );
  assert( pPager->eState==PAGER_READER || !pbOpen );
  assert( pbOpen==0 || *pbOpen==0 );
  assert( pbOpen!=0 || (!pPager->tempFile && !pPager->pWal) );

  if( !pPager->tempFile && !pPager->pWal ){
    if( !sqlite3PagerWalSupported(pPager) ) return SQLITE_CANTOPEN;

    /* Close any rollback journal previously open */
    sqlite3OsClose(pPager->jfd);

    rc = pagerOpenWal(pPager);
    if( rc==SQLITE_OK ){
      pPager->journalMode = PAGER_JOURNALMODE_WAL;
      pPager->eState = PAGER_OPEN;
    }
  }else{
    *pbOpen = 1;
  }

  return rc;
}